

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O1

void __thiscall t_rs_generator::generate_const(t_rs_generator *this,t_const *tconst)

{
  pointer pcVar1;
  t_type *this_00;
  t_const_value *tvalue;
  bool bVar2;
  int iVar3;
  t_rs_generator *ptVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  t_rs_generator *this_01;
  t_base_type *tbase_type;
  string name;
  string local_48;
  
  pcVar1 = (tconst->name_)._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + (tconst->name_)._M_string_length);
  this_00 = tconst->type_;
  tvalue = tconst->value_;
  ptVar4 = (t_rs_generator *)t_type::get_true_type(this_00);
  this_01 = ptVar4;
  iVar3 = (*(ptVar4->super_t_generator)._vptr_t_generator[5])();
  if (((char)iVar3 == '\0') ||
     ((int)(ptVar4->super_t_generator).out_dir_base_._M_string_length == 7)) {
    bVar2 = can_generate_const_holder(this_01,this_00);
    if (!bVar2) {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      std::operator+(__return_storage_ptr__,"cannot generate const for ",&local_48);
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
    render_const_value_holder(this,&local_48,this_00,tvalue);
  }
  else {
    render_const_value(this,&local_48,this_00,tvalue);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_rs_generator::generate_const(t_const* tconst) {
  string name = tconst->get_name();
  t_type* ttype = tconst->get_type();
  t_const_value* tvalue = tconst->get_value();

  if (can_generate_simple_const(ttype)) {
    render_const_value(name, ttype, tvalue);
  } else if (can_generate_const_holder(ttype)) {
    render_const_value_holder(name, ttype, tvalue);
  } else {
    throw "cannot generate const for " + name;
  }
}